

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O0

void __thiscall PrimitiveExpression<String>::~PrimitiveExpression(PrimitiveExpression<String> *this)

{
  PrimitiveExpression<String> *this_local;
  
  ~PrimitiveExpression(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

PrimitiveExpression() = default;